

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

timestamp_t
duckdb::TryCastCInternal<duckdb::uhugeint_t,duckdb::timestamp_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  NotImplementedException *this;
  size_type __dnew;
  size_type local_48;
  string local_40;
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_48 = 0x26;
  local_40._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_40.field_2._M_allocated_capacity = local_48;
  builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for cast (%s -> %s)",0x26);
  local_40._M_string_length = local_48;
  local_40._M_dataplus._M_p[local_48] = '\0';
  NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
            (this,&local_40,UINT128,INT64);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

T UnsafeFetch(duckdb_result *result, idx_t col, idx_t row) {
	return UnsafeFetchFromPtr<T>(UnsafeFetchPtr<T>(result, col, row));
}